

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O1

void handle_checkenum(BinarySource *in,strbuf *out)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  ulong uVar4;
  undefined8 *puVar5;
  char *pcVar6;
  bool bVar7;
  ptrlen pVar8;
  ptrlen pl;
  
  pVar8 = get_word(in);
  pl = get_word(in);
  _Var3 = ptrlen_eq_string(pVar8,"hashalg");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"md5");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_hashalg_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 0x10) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 0x10;
    }
  }
  else {
    bVar7 = false;
  }
  _Var3 = ptrlen_eq_string(pVar8,"macalg");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"hmac_md5");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_macalg_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 6) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 6;
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"keyalg");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"dsa");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_keyalg_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 0xc) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 0xc;
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"cipheralg");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"3des_ctr");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_cipheralg_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 0x1b) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 0x1b;
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"dh_group");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"group1");
    bVar7 = true;
    if (!_Var3) {
      bVar2 = true;
      do {
        bVar7 = bVar2;
        if (!bVar7) break;
        _Var3 = ptrlen_eq_string(pl,"group14");
        bVar2 = false;
      } while (!_Var3);
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"ecdh_alg");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"curve25519");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_ecdh_alg_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 4) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 4;
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"rsaorder");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"exponent_first");
    bVar7 = true;
    if (!_Var3) {
      bVar2 = true;
      do {
        bVar7 = bVar2;
        if (bVar7 == false) break;
        _Var3 = ptrlen_eq_string(pl,"modulus_first");
        bVar2 = false;
      } while (!_Var3);
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"primegenpolicy");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"probabilistic");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_primegenpolicy_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 3) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 3;
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"argon2flavour");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"d");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_argon2flavour_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 8) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 8;
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"fptype");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"md5");
    bVar7 = true;
    if (!_Var3) {
      bVar2 = true;
      do {
        bVar7 = bVar2;
        if (bVar7 == false) break;
        _Var3 = ptrlen_eq_string(pl,"sha256");
        bVar2 = false;
      } while (!_Var3);
    }
  }
  _Var3 = ptrlen_eq_string(pVar8,"httpdigesthash");
  if (_Var3) {
    _Var3 = ptrlen_eq_string(pl,"MD5");
    bVar7 = true;
    if (!_Var3) {
      puVar5 = (undefined8 *)(enum_translate_httpdigesthash_mapping + 0x10);
      uVar1 = 0;
      do {
        uVar4 = uVar1;
        if (uVar4 == 2) break;
        _Var3 = ptrlen_eq_string(pl,(char *)*puVar5);
        puVar5 = puVar5 + 2;
        uVar1 = uVar4 + 1;
      } while (!_Var3);
      bVar7 = uVar4 < 2;
    }
  }
  pcVar6 = "bad\n";
  if (bVar7 != false) {
    pcVar6 = "ok\n";
  }
  pVar8.len = 4 - (ulong)bVar7;
  pVar8.ptr = pcVar6;
  BinarySink_put_datapl(out->binarysink_,pVar8);
  return;
}

Assistant:

static void handle_checkenum(BinarySource *in, strbuf *out)
{
    ptrlen type = get_word(in);
    ptrlen value = get_word(in);
    bool ok = false;

    #define BEGIN_ENUM_TYPE(name) \
    if (ptrlen_eq_string(type, #name))                  \
        ok = enum_translate_##name(value, NULL);
    #define ENUM_VALUE(name, value)
    #define END_ENUM_TYPE(name)
    #include "testcrypt-enum.h"
    #undef BEGIN_ENUM_TYPE
    #undef ENUM_VALUE
    #undef END_ENUM_TYPE

    put_dataz(out, ok ? "ok\n" : "bad\n");
}